

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall despot::Parser::Print(Parser *this,ostream *out)

{
  ostream *poVar1;
  long lVar2;
  int s;
  ulong uVar3;
  int s_2;
  
  poVar1 = std::operator<<(out,"State variables");
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar2 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)(this->curr_state_vars_).
                             super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->curr_state_vars_).
                            super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0xc0); uVar3 = uVar3 + 1) {
    poVar1 = std::operator<<(out,"s[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar3);
    poVar1 = std::operator<<(poVar1,"] = ");
    poVar1 = despot::operator<<(poVar1,(StateVar *)
                                       ((long)&(((this->curr_state_vars_).
                                                 super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super_NamedVar).super_Variable._vptr_Variable + lVar2
                                       ));
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar2 = lVar2 + 0xc0;
  }
  std::endl<char,std::char_traits<char>>(out);
  poVar1 = std::operator<<(out,"Observation variables");
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar2 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)(this->obs_vars_).
                             super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->obs_vars_).
                            super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x78); uVar3 = uVar3 + 1) {
    poVar1 = std::operator<<(out,"o[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar3);
    poVar1 = std::operator<<(poVar1,"] = ");
    poVar1 = despot::operator<<(poVar1,(NamedVar *)
                                       ((long)&(((this->obs_vars_).
                                                 super__Vector_base<despot::NamedVar,_std::allocator<despot::NamedVar>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super_Variable)._vptr_Variable + lVar2));
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar2 = lVar2 + 0x78;
  }
  std::endl<char,std::char_traits<char>>(out);
  poVar1 = std::operator<<(out,"# Initial belief");
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar2 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)(this->initial_belief_funcs_).
                             super__Vector_base<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->initial_belief_funcs_).
                            super__Vector_base<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x70); uVar3 = uVar3 + 1) {
    poVar1 = std::operator<<(out,"s[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar3);
    poVar1 = std::operator<<(poVar1,"] = ");
    poVar1 = despot::operator<<(poVar1,(Function *)
                                       ((long)&(((this->initial_belief_funcs_).
                                                 super__Vector_base<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super_CPT).super_Function._vptr_Function + lVar2));
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar2 = lVar2 + 0x70;
  }
  std::endl<char,std::char_traits<char>>(out);
  poVar1 = std::operator<<(out,"# Transition probabilities");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(this->transition_funcs_).
                            super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->transition_funcs_).
                            super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    poVar1 = std::operator<<(out,"s[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar3);
    poVar1 = std::operator<<(poVar1,"] = ");
    poVar1 = despot::operator<<(poVar1,&(this->transition_funcs_).
                                        super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar3]->
                                        super_Function);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::endl<char,std::char_traits<char>>(out);
  poVar1 = std::operator<<(out,"# Observation probabilities");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(this->obs_funcs_).
                            super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->obs_funcs_).
                            super__Vector_base<despot::CPT_*,_std::allocator<despot::CPT_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3); uVar3 = uVar3 + 1) {
    poVar1 = std::operator<<(out,"o[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar3);
    poVar1 = std::operator<<(poVar1,"] = ");
    poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  std::endl<char,std::char_traits<char>>(out);
  poVar1 = std::operator<<(out,"# Reward functions");
  std::endl<char,std::char_traits<char>>(poVar1);
  lVar2 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)(this->reward_funcs_).
                             super__Vector_base<despot::Function,_std::allocator<despot::Function>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->reward_funcs_).
                            super__Vector_base<despot::Function,_std::allocator<despot::Function>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x58); uVar3 = uVar3 + 1) {
    poVar1 = std::operator<<(out,"r[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)uVar3);
    poVar1 = std::operator<<(poVar1,"] = ");
    poVar1 = despot::operator<<(poVar1,(Function *)
                                       ((long)&((this->reward_funcs_).
                                                super__Vector_base<despot::Function,_std::allocator<despot::Function>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                               _vptr_Function + lVar2));
    std::endl<char,std::char_traits<char>>(poVar1);
    lVar2 = lVar2 + 0x58;
  }
  std::endl<char,std::char_traits<char>>(out);
  return;
}

Assistant:

void Parser::Print(ostream& out) const {
	out << "State variables" << endl;
	for (int s = 0; s < curr_state_vars_.size(); s++) {
		out << "s[" << s << "] = " << curr_state_vars_[s] << endl;
	}
	out << endl;

	out << "Observation variables" << endl;
	for (int o = 0; o < obs_vars_.size(); o++) {
		out << "o[" << o << "] = " << obs_vars_[o] << endl;
	}
	out << endl;

	out << "# Initial belief" << endl;
	for (int s = 0; s < initial_belief_funcs_.size(); s++) {
		out << "s[" << s << "] = " << initial_belief_funcs_[s] << endl;
	}
	out << endl;

	out << "# Transition probabilities" << endl;
	for (int s = 0; s < transition_funcs_.size(); s++) {
		out << "s[" << s << "] = " << *transition_funcs_[s] << endl;
	}
	out << endl;

	out << "# Observation probabilities" << endl;
	for (int o = 0; o < obs_funcs_.size(); o++) {
		out << "o[" << o << "] = " << obs_funcs_[o] << endl;
	}
	out << endl;

	out << "# Reward functions" << endl;
	for (int r = 0; r < reward_funcs_.size(); r++) {
		out << "r[" << r << "] = " << reward_funcs_[r] << endl;
	}
	out << endl;
}